

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O0

PDFRectangle * __thiscall
PDFPageInput::GetCropBox(PDFRectangle *__return_storage_ptr__,PDFPageInput *this)

{
  EStatusCode EVar1;
  PDFDictionary *inDictionary;
  PDFObject *inPDFObject;
  PDFArray *inPDFArray;
  PDFRectangle local_88;
  allocator<char> local_61;
  string local_60;
  undefined1 local_30 [8];
  PDFObjectCastPtr<PDFArray> cropBox;
  PDFPageInput *this_local;
  PDFRectangle *result;
  
  cropBox.super_RefCountPtr<PDFArray>.mValue._7_1_ = 0;
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  inDictionary = RefCountPtr<PDFDictionary>::GetPtr
                           (&(this->mPageObject).super_RefCountPtr<PDFDictionary>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"CropBox",&local_61);
  inPDFObject = QueryInheritedValue(this,inDictionary,&local_60);
  PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_30,inPDFObject);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  inPDFArray = RefCountPtr<PDFArray>::GetPtr((RefCountPtr<PDFArray> *)local_30);
  EVar1 = SetPDFRectangleFromPDFArray(this,inPDFArray,__return_storage_ptr__);
  if (EVar1 != eSuccess) {
    GetMediaBox(&local_88,this);
    __return_storage_ptr__->LowerLeftX = local_88.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_88.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_88.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_88.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_88);
  }
  cropBox.super_RefCountPtr<PDFArray>.mValue._7_1_ = 1;
  PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_30);
  if ((cropBox.super_RefCountPtr<PDFArray>.mValue._7_1_ & 1) == 0) {
    PDFRectangle::~PDFRectangle(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFPageInput::GetCropBox()
{
    PDFRectangle result;
    PDFObjectCastPtr<PDFArray> cropBox(QueryInheritedValue(mPageObject.GetPtr(),"CropBox"));
    
    if(SetPDFRectangleFromPDFArray(cropBox.GetPtr(),result) != eSuccess)
        result = GetMediaBox();
    return result;
}